

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O0

void Saig_ManPrintConeOne(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *p_00;
  void *Entry;
  int local_44;
  uint local_40;
  int nCurOld;
  int nCurPrev;
  int nCurNew;
  int i;
  int s;
  Vec_Ptr_t *vTotal;
  Vec_Ptr_t *vCur;
  Vec_Ptr_t *vPrev;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ObjIsPo(p,pObj);
  if (iVar1 == 0) {
    __assert_fail("Saig_ObjIsPo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigCone.c"
                  ,0x6b,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
  }
  vCur = Vec_PtrAlloc(100);
  Vec_PtrPush(vCur,pObj);
  vTotal = Saig_ManSupport(p,vCur);
  Vec_PtrClear(vCur);
  uVar2 = Aig_ObjCioId(pObj);
  printf("    PO %3d  ",(ulong)uVar2);
  p_00 = Vec_PtrAlloc(100);
  nCurNew = 0;
  while( true ) {
    local_44 = 0;
    local_40 = 0;
    nCurOld = 0;
    for (nCurPrev = 0; iVar1 = Vec_PtrSize(vTotal), nCurPrev < iVar1; nCurPrev = nCurPrev + 1) {
      Entry = Vec_PtrEntry(vTotal,nCurPrev);
      iVar1 = Vec_PtrFind(p_00,Entry);
      if (iVar1 == -1) {
        Vec_PtrPush(p_00,Entry);
        nCurOld = nCurOld + 1;
      }
      else {
        iVar1 = Vec_PtrFind(vCur,Entry);
        if (iVar1 < 0) {
          local_44 = local_44 + 1;
        }
        else {
          local_40 = local_40 + 1;
        }
      }
    }
    iVar1 = Vec_PtrSize(vTotal);
    if (nCurOld + local_40 + local_44 != iVar1) break;
    uVar2 = Vec_PtrSize(p_00);
    uVar3 = Vec_PtrSize(vTotal);
    printf("%d:%d %d=%d+%d+%d  ",(ulong)(uint)nCurNew,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)nCurOld
           ,(ulong)local_40,local_44);
    if (nCurOld == 0) {
      printf("\n");
      Vec_PtrFree(vCur);
      Vec_PtrFree(vTotal);
      Vec_PtrFree(p_00);
      return;
    }
    Vec_PtrFree(vCur);
    vCur = vTotal;
    vTotal = Saig_ManSupport(p,vTotal);
    nCurNew = nCurNew + 1;
  }
  __assert_fail("nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigCone.c"
                ,0x85,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Saig_ManPrintConeOne( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vPrev, * vCur, * vTotal;
    int s, i, nCurNew, nCurPrev, nCurOld;
    assert( Saig_ObjIsPo(p, pObj) );
    // start the array
    vPrev = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vPrev, pObj );
    // get the current support
    vCur = Saig_ManSupport( p, vPrev );  
    Vec_PtrClear( vPrev );
    printf( "    PO %3d  ", Aig_ObjCioId(pObj) );
    // continue computing supports as long as there are now nodes
    vTotal = Vec_PtrAlloc( 100 );
    for ( s = 0; ; s++ )
    {
        // classify current into those new, prev, and older 
        nCurNew = nCurPrev = nCurOld = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vCur, pObj, i )
        {
            if ( Vec_PtrFind(vTotal, pObj) == -1 )
            {
                Vec_PtrPush( vTotal, pObj );
                nCurNew++;
            }
            else if ( Vec_PtrFind(vPrev, pObj) >= 0 )
                nCurPrev++;
            else
                nCurOld++;
        }
        assert( nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur) );
        // print the result
        printf( "%d:%d %d=%d+%d+%d  ", s, Vec_PtrSize(vTotal), Vec_PtrSize(vCur), nCurNew, nCurPrev, nCurOld ); 
        if ( nCurNew == 0 )
            break;
        // compute one more step
        Vec_PtrFree( vPrev );
        vCur = Saig_ManSupport( p, vPrev = vCur );
    }
    printf( "\n" );
    Vec_PtrFree( vPrev );
    Vec_PtrFree( vCur );
    Vec_PtrFree( vTotal );
}